

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O2

void __thiscall
helics::LogManager::updateRemote(LogManager *this,GlobalFederateId destination,int level)

{
  pointer ppVar1;
  int local_10;
  GlobalFederateId local_c;
  
  ppVar1 = (this->remoteTargets).
           super__Vector_base<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (ppVar1 == (this->remoteTargets).
                  super__Vector_base<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      local_10 = level;
      local_c.gid = destination.gid;
      std::
      vector<std::pair<helics::GlobalFederateId,int>,std::allocator<std::pair<helics::GlobalFederateId,int>>>
      ::emplace_back<helics::GlobalFederateId&,int&>
                ((vector<std::pair<helics::GlobalFederateId,int>,std::allocator<std::pair<helics::GlobalFederateId,int>>>
                  *)&this->remoteTargets,&local_c,&local_10);
      updateMaxLogLevel(this);
      return;
    }
    if ((ppVar1->first).gid == destination.gid) break;
    ppVar1 = ppVar1 + 1;
  }
  ppVar1->second = level;
  return;
}

Assistant:

void LogManager::updateRemote(GlobalFederateId destination, int level)
{
    for (auto& rl : remoteTargets) {
        if (rl.first == destination) {
            rl.second = level;
            return;
        }
    }
    remoteTargets.emplace_back(destination, level);
    updateMaxLogLevel();
}